

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lad.cc
# Opt level: O2

InputGraph __thiscall
anon_unknown.dwarf_1ce045::read_any_lad
          (anon_unknown_dwarf_1ce045 *this,ifstream *infile,string *filename,bool directed,
          bool vertex_labels,bool edge_labels)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  istream *piVar5;
  size_type __n;
  GraphFileError *pGVar6;
  bool bVar7;
  string_view l;
  string_view l_00;
  string_view l_01;
  string_view label;
  string rest;
  string before;
  string after;
  
  InputGraph::InputGraph((InputGraph *)this,0,vertex_labels,edge_labels);
  iVar1 = read_word(infile);
  InputGraph::resize((InputGraph *)this,iVar1);
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rest,"error reading size",(allocator<char> *)&before);
    GraphFileError::GraphFileError(pGVar6,filename,&rest,true);
    __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  iVar1 = 0;
  do {
    iVar2 = InputGraph::size((InputGraph *)this);
    if (iVar2 <= iVar1) {
      rest._M_dataplus._M_p = (pointer)&rest.field_2;
      rest._M_string_length = 0;
      rest.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar5 = std::operator>>((istream *)infile,(string *)&rest);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
          if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 2) != 0) {
            std::__cxx11::string::~string((string *)&rest);
            return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                   (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)this;
          }
          pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&before,"EOF not reached",(allocator<char> *)&after);
          GraphFileError::GraphFileError(pGVar6,filename,&before,true);
          __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&rest,'=',0);
        if (__n == 0xffffffffffffffff) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&before,&rest,0,__n);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&after,&rest,__n + 1,0xffffffffffffffff);
        iVar1 = std::__cxx11::stoi(&before,(size_t *)0x0,10);
        l_01._M_str = after._M_dataplus._M_p;
        l_01._M_len = after._M_string_length;
        InputGraph::set_vertex_name((InputGraph *)this,iVar1,l_01);
        std::__cxx11::string::~string((string *)&after);
        std::__cxx11::string::~string((string *)&before);
      }
      pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
      std::operator+(&after,"EOF not reached, next text is \"",&rest);
      std::operator+(&before,&after,"\"");
      GraphFileError::GraphFileError(pGVar6,filename,&before,true);
      __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    std::__cxx11::to_string(&rest,iVar1);
    l._M_str = rest._M_dataplus._M_p;
    l._M_len = rest._M_string_length;
    InputGraph::set_vertex_name((InputGraph *)this,iVar1,l);
    std::__cxx11::string::~string((string *)&rest);
    if (vertex_labels) {
      iVar2 = read_word(infile);
      if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
        pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rest,"error reading label",(allocator<char> *)&before);
        GraphFileError::GraphFileError(pGVar6,filename,&rest,true);
        __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      std::__cxx11::to_string(&rest,iVar2);
      l_00._M_str = rest._M_dataplus._M_p;
      l_00._M_len = rest._M_string_length;
      InputGraph::set_vertex_label((InputGraph *)this,iVar1,l_00);
      std::__cxx11::string::~string((string *)&rest);
    }
    uVar3 = read_word(infile);
    if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
      pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rest,"error reading edges count",(allocator<char> *)&before);
      GraphFileError::GraphFileError(pGVar6,filename,&rest,true);
      __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    uVar3 = ~((int)uVar3 >> 0x1f) & uVar3;
    while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
      iVar2 = read_word(infile);
      if (iVar2 < 0) {
LAB_00134f83:
        pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rest,"edge index out of bounds",(allocator<char> *)&before);
        GraphFileError::GraphFileError(pGVar6,filename,&rest,true);
        __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      iVar4 = InputGraph::size((InputGraph *)this);
      if (iVar4 <= iVar2) goto LAB_00134f83;
      if (edge_labels) {
        iVar4 = read_word(infile);
        if (iVar4 < 0) {
          pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&rest,"edge label invalid",(allocator<char> *)&before);
          GraphFileError::GraphFileError(pGVar6,filename,&rest,true);
          __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        std::__cxx11::to_string(&rest,iVar4);
        label._M_str = rest._M_dataplus._M_p;
        label._M_len = rest._M_string_length;
        InputGraph::add_directed_edge((InputGraph *)this,iVar1,iVar2,label);
        std::__cxx11::string::~string((string *)&rest);
      }
      else if (directed) {
        InputGraph::add_directed_edge
                  ((InputGraph *)this,iVar1,iVar2,(string_view)(ZEXT816(0x137f7a) << 0x40));
      }
      else {
        InputGraph::add_edge((InputGraph *)this,iVar1,iVar2);
      }
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

auto read_any_lad(ifstream && infile, const string & filename,
        bool directed,
        bool vertex_labels,
        bool edge_labels) -> InputGraph
    {
        InputGraph result{0, vertex_labels, edge_labels};

        result.resize(read_word(infile));
        if (! infile)
            throw GraphFileError{filename, "error reading size", true};

        for (int r = 0; r < result.size(); ++r) {
            result.set_vertex_name(r, to_string(r));

            if (vertex_labels) {
                int l = read_word(infile);
                if (! infile)
                    throw GraphFileError{filename, "error reading label", true};

                result.set_vertex_label(r, to_string(l));
            }

            int c_end = read_word(infile);
            if (! infile)
                throw GraphFileError{filename, "error reading edges count", true};

            for (int c = 0; c < c_end; ++c) {
                int e = read_word(infile);

                if (e < 0 || e >= result.size())
                    throw GraphFileError{filename, "edge index out of bounds", true};

                if (edge_labels) {
                    int l = read_word(infile);
                    if (l < 0)
                        throw GraphFileError{filename, "edge label invalid", true};

                    result.add_directed_edge(r, e, to_string(l));
                }
                else if (directed)
                    result.add_directed_edge(r, e, "");
                else
                    result.add_edge(r, e);
            }
        }

        string rest;
        while (infile >> rest) {
            auto equals_pos = rest.find('=');
            if (string::npos == equals_pos)
                throw GraphFileError{filename, "EOF not reached, next text is \"" + rest + "\"", true};
            else {
                string before = rest.substr(0, equals_pos), after = rest.substr(equals_pos + 1);
                result.set_vertex_name(stoi(before), after);
            }
        }
        if (! infile.eof())
            throw GraphFileError{filename, "EOF not reached", true};

        return result;
    }